

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_parse_ip.c
# Opt level: O0

_Bool x11_parse_ip(char *addr_string,unsigned_long *ip)

{
  int iVar1;
  int local_38;
  int local_34;
  int i [4];
  unsigned_long *ip_local;
  char *addr_string_local;
  
  if ((addr_string != (char *)0x0) &&
     (iVar1 = __isoc99_sscanf(addr_string,"%d.%d.%d.%d",&local_38,&local_34,i,i + 1), iVar1 == 4)) {
    *ip = (long)(local_38 << 0x18 | local_34 << 0x10 | i[0] << 8 | i[1]);
    return true;
  }
  return false;
}

Assistant:

bool x11_parse_ip(const char *addr_string, unsigned long *ip)
{
    int i[4];
    if (addr_string &&
        4 == sscanf(addr_string, "%d.%d.%d.%d", i+0, i+1, i+2, i+3)) {
        *ip = (i[0] << 24) | (i[1] << 16) | (i[2] << 8) | i[3];
        return true;
    } else {
        return false;
    }
}